

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Animatable<bool>_>::TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *this,
          TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *param_1)

{
  AttrMetas::AttrMetas(&this->_metas,&param_1->_metas);
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&this->_paths,&param_1->_paths);
  nonstd::optional_lite::optional<tinyusdz::Animatable<bool>_>::optional
            (&this->_attrib,&param_1->_attrib);
  this->_empty = param_1->_empty;
  Animatable<bool>::Animatable(&this->_fallback,&param_1->_fallback);
  this->_blocked = param_1->_blocked;
  return;
}

Assistant:

static std::string type_name() { return value::TypeTraits<T>::type_name(); }